

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::BufferQueue::Read(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  shared_ptr<cppnet::InnerBuffer> local_88;
  undefined1 local_78 [8];
  shared_ptr<cppnet::BufferBlock> buffer_read;
  uint local_60;
  uint32_t cur_read_len;
  uint32_t total_read_len;
  uint32_t can_write_size;
  undefined1 local_38 [8];
  shared_ptr<cppnet::BufferQueue> buffer_queue;
  uint32_t len_local;
  shared_ptr<cppnet::InnerBuffer> *buffer_local;
  BufferQueue *this_local;
  
  buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._4_4_ = len;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)buffer);
  if (bVar1) {
    if (buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ == 0) {
      buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    }
    if (buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
    else {
      std::dynamic_pointer_cast<cppnet::BufferQueue,cppnet::InnerBuffer>
                ((shared_ptr<cppnet::InnerBuffer> *)local_38);
      peVar2 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->_buffer_write);
      if (!bVar1) {
        peVar2 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        (*(peVar2->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        std::__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_38);
        List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)&total_read_len);
        peVar2 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        std::shared_ptr<cppnet::BufferBlock>::operator=
                  (&peVar2->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)&total_read_len);
        std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                  ((shared_ptr<cppnet::BufferBlock> *)&total_read_len);
      }
      peVar2 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      peVar3 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar2->_buffer_write);
      cur_read_len = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xb])();
      local_60 = 0;
      buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 0;
      List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_78);
      do {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
        if (!bVar1) break;
        peVar3 = std::
                 __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_78);
        peVar2 = std::
                 __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        std::shared_ptr<cppnet::InnerBuffer>::shared_ptr<cppnet::BufferBlock,void>
                  (&local_88,&peVar2->_buffer_write);
        buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xc])
                                (peVar3,&local_88,(ulong)cur_read_len);
        std::shared_ptr<cppnet::InnerBuffer>::~shared_ptr(&local_88);
        local_60 = buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_ + local_60;
        if (buffer_read.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ < cur_read_len) {
          cur_read_len = cur_read_len -
                         buffer_read.
                         super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_;
          bVar1 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_78,&this->_buffer_write);
          if (bVar1) {
            std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_buffer_write);
            ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_a8);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
            std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                      ((shared_ptr<cppnet::BufferBlock> *)local_a8);
            if (!bVar1) {
              (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])();
              break;
            }
            std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_buffer_write);
            ListSlot<cppnet::BufferBlock>::GetNext((ListSlot<cppnet::BufferBlock> *)local_b8);
            std::shared_ptr<cppnet::BufferBlock>::operator=
                      (&this->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)local_b8);
            std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                      ((shared_ptr<cppnet::BufferBlock> *)local_b8);
          }
          List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)(local_d8 + 0x10));
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)(local_d8 + 0x10));
          List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_d8);
          std::shared_ptr<cppnet::BufferBlock>::operator=
                    ((shared_ptr<cppnet::BufferBlock> *)local_78,
                     (shared_ptr<cppnet::BufferBlock> *)local_d8);
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)local_d8);
        }
        else {
          if (buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ <= local_60) break;
          peVar2 = std::
                   __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          (*(peVar2->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
          std::__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_38);
          List<cppnet::BufferBlock>::GetTail((List<cppnet::BufferBlock> *)(local_a8 + 0x10));
          peVar2 = std::
                   __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          std::shared_ptr<cppnet::BufferBlock>::operator=
                    (&peVar2->_buffer_write,(shared_ptr<cppnet::BufferBlock> *)(local_a8 + 0x10));
          std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                    ((shared_ptr<cppnet::BufferBlock> *)(local_a8 + 0x10));
          peVar2 = std::
                   __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          peVar3 = std::
                   __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar2->_buffer_write);
          cur_read_len = (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[0xb])();
        }
      } while (local_60 <
               buffer_queue.super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_);
      this->_can_read_length = this->_can_read_length - local_60;
      peVar2 = std::
               __shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      peVar2->_can_read_length = local_60 + peVar2->_can_read_length;
      this_local._4_4_ = local_60;
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_78)
      ;
      std::shared_ptr<cppnet::BufferQueue>::~shared_ptr((shared_ptr<cppnet::BufferQueue> *)local_38)
      ;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = GetCanReadLength();
    } 
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    if (!buffer_queue->_buffer_write) {
        buffer_queue->Append();
        buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
    }

    uint32_t can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();
    uint32_t total_read_len = 0;
    uint32_t cur_read_len = 0;

    auto buffer_read = _buffer_list.GetHead();
    while (buffer_read) {
        cur_read_len = buffer_read->Read(buffer_queue->_buffer_write, can_write_size);
        total_read_len += cur_read_len;

        // current write block is full
        if (cur_read_len >= can_write_size) {
            if (total_read_len >= len) {
                break;
            }

            buffer_queue->Append();
            buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
            can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();

        // current read block is empty
        } else {
            can_write_size -= cur_read_len;
            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

        if (total_read_len >= len) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    buffer_queue->_can_read_length += total_read_len;
    return total_read_len;
}